

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O2

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
          (DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *this,IntervalT *I,
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
          *vals)

{
  bool bVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  
  bVar3 = false;
  for (p_Var2 = (vals->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(vals->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    bVar1 = DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::_add
                      ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)this,I,
                       (RWNode **)(p_Var2 + 1),false);
    bVar3 = (bool)(bVar3 | bVar1);
  }
  return bVar3;
}

Assistant:

bool add(const IntervalT &I, const ContT &vals) {
        bool changed = false;
        for (const ValueT &val : vals) {
            changed |= _add(I, val, false);
        }
        return changed;
    }